

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaUnit.cpp
# Opt level: O2

uint __thiscall NaUnit::NeedFeedback(NaUnit *this)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  uint uVar3;
  
  iVar1 = (*(this->super_NaLogging)._vptr_NaLogging[3])();
  uVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x28))
                    ((long *)CONCAT44(extraout_var,iVar1));
  uVar3 = this->nFbDepth - uVar2;
  if (this->nFbDepth < uVar2) {
    uVar3 = 0;
  }
  return uVar3;
}

Assistant:

unsigned
NaUnit::NeedFeedback ()
{
    unsigned    nTimeIndex = (unsigned)Timer().CurrentIndex();

    if(nTimeIndex >= nFbDepth)
        // All needed feedback values are already computed by the unit
        return 0;
    // Some feedback values are still needed.
    return nFbDepth - nTimeIndex;
}